

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_type.cpp
# Opt level: O2

void __thiscall
libtorrent::aux::socket_closer::socket_closer
          (socket_closer *this,io_context *ioc,shared_ptr<void> *holder,socket_type *s)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  duration local_18;
  
  (this->h).super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar1 = (holder->super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var2 = (holder->super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  (holder->super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->h).super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
  (this->h).super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var2;
  (holder->super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = (element_type *)0x0;
  ::std::
  make_shared<boost::asio::basic_waitable_timer<std::chrono::_V2::system_clock,boost::asio::wait_traits<std::chrono::_V2::system_clock>,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>,boost::asio::io_context&>
            ((io_context *)&this->t);
  this->sock = s;
  local_18.__r = 3000000000;
  boost::asio::
  basic_waitable_timer<std::chrono::_V2::system_clock,_boost::asio::wait_traits<std::chrono::_V2::system_clock>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::expires_after((this->t).
                  super___shared_ptr<boost::asio::basic_waitable_timer<std::chrono::_V2::system_clock,_boost::asio::wait_traits<std::chrono::_V2::system_clock>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr,&local_18);
  boost::asio::
  basic_waitable_timer<std::chrono::_V2::system_clock,boost::asio::wait_traits<std::chrono::_V2::system_clock>,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
  ::async_wait<libtorrent::aux::socket_closer&>
            ((basic_waitable_timer<std::chrono::_V2::system_clock,boost::asio::wait_traits<std::chrono::_V2::system_clock>,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
              *)(this->t).
                super___shared_ptr<boost::asio::basic_waitable_timer<std::chrono::_V2::system_clock,_boost::asio::wait_traits<std::chrono::_V2::system_clock>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr,this);
  return;
}

Assistant:

socket_closer(io_context& ioc
			, std::shared_ptr<void> holder
			, socket_type* s)
			: h(std::move(holder))
			, t(std::make_shared<deadline_timer>(ioc))
			, sock(s)
		{
			t->expires_after(seconds(3));
			t->async_wait(*this);
		}